

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

_Bool Curl_compareheader(char *headerline,char *header,char *content)

{
  int iVar1;
  size_t max;
  char *max_00;
  bool bVar2;
  char *local_50;
  char *end;
  char *start;
  size_t len;
  size_t clen;
  size_t hlen;
  char *content_local;
  char *header_local;
  char *headerline_local;
  
  max = strlen(header);
  iVar1 = Curl_strncasecompare(headerline,header,max);
  if (iVar1 != 0) {
    end = headerline + max;
    while( true ) {
      bVar2 = false;
      if (*end != '\0') {
        iVar1 = Curl_isspace((uint)(byte)*end);
        bVar2 = iVar1 != 0;
      }
      if (!bVar2) break;
      end = end + 1;
    }
    local_50 = strchr(end,0xd);
    if ((local_50 == (char *)0x0) && (local_50 = strchr(end,10), local_50 == (char *)0x0)) {
      local_50 = strchr(end,0);
    }
    start = local_50 + -(long)end;
    max_00 = (char *)strlen(content);
    for (; max_00 <= start; start = start + -1) {
      iVar1 = Curl_strncasecompare(end,content,(size_t)max_00);
      if (iVar1 != 0) {
        return true;
      }
      end = end + 1;
    }
  }
  return false;
}

Assistant:

bool
Curl_compareheader(const char *headerline, /* line to check */
                   const char *header,  /* header keyword _with_ colon */
                   const char *content) /* content string to find */
{
  /* RFC2616, section 4.2 says: "Each header field consists of a name followed
   * by a colon (":") and the field value. Field names are case-insensitive.
   * The field value MAY be preceded by any amount of LWS, though a single SP
   * is preferred." */

  size_t hlen = strlen(header);
  size_t clen;
  size_t len;
  const char *start;
  const char *end;

  if(!strncasecompare(headerline, header, hlen))
    return FALSE; /* doesn't start with header */

  /* pass the header */
  start = &headerline[hlen];

  /* pass all white spaces */
  while(*start && ISSPACE(*start))
    start++;

  /* find the end of the header line */
  end = strchr(start, '\r'); /* lines end with CRLF */
  if(!end) {
    /* in case there's a non-standard compliant line here */
    end = strchr(start, '\n');

    if(!end)
      /* hm, there's no line ending here, use the zero byte! */
      end = strchr(start, '\0');
  }

  len = end-start; /* length of the content part of the input line */
  clen = strlen(content); /* length of the word to find */

  /* find the content string in the rest of the line */
  for(; len >= clen; len--, start++) {
    if(strncasecompare(start, content, clen))
      return TRUE; /* match! */
  }

  return FALSE; /* no match */
}